

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileWire.cpp
# Opt level: O3

void __thiscall
TileWire::TileWire(TileWire *this,Board *boardPtr,Vector2u *position,bool noAdjacentUpdates,
                  Direction direction,Type type,State state1,State state2)

{
  Tile::Tile(&this->super_Tile,boardPtr,position,true,true);
  (this->super_Tile)._vptr_Tile = (_func_int **)&PTR__TileWire_001d2028;
  memcpy(&(this->super_Tile).field_0x21,&DAT_0019bed3,0x140);
  if (type == STRAIGHT) {
    direction = (int)direction % 2;
LAB_0013cc62:
    (this->super_Tile)._direction = direction;
    this->_type = type;
    this->_state1 = state1;
  }
  else {
    if (type + ~CROSSOVER < 0xfffffffe) goto LAB_0013cc62;
    this->_type = type;
    this->_state1 = state1;
    if (type == CROSSOVER) goto LAB_0013cc79;
  }
  state2 = LOW;
LAB_0013cc79:
  this->_state2 = state2;
  this->_updateTimestamp1 = 0;
  this->_updateTimestamp2 = 0;
  addUpdate(this,false,noAdjacentUpdates);
  return;
}

Assistant:

TileWire::TileWire(Board* boardPtr, const Vector2u& position, bool noAdjacentUpdates, Direction direction, Type type, State state1, State state2) : Tile(boardPtr, position, true, true) {
    if (type == STRAIGHT) {
        _direction = static_cast<Direction>(direction % 2);
    } else if (type != JUNCTION && type != CROSSOVER) {
        _direction = direction;
    }
    _type = type;
    _state1 = state1;
    if (type == CROSSOVER) {
        _state2 = state2;
    } else {
        _state2 = LOW;
    }
    _updateTimestamp1 = 0;
    _updateTimestamp2 = 0;
    addUpdate(false, noAdjacentUpdates);
}